

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O1

int nondefp(sexp x)

{
  sexp_tag_t sVar1;
  int iVar2;
  sexp psVar3;
  bool bVar4;
  
  if (((ulong)x & 3) == 0) {
    sVar1 = x->tag;
    bVar4 = sVar1 == 6;
    if ((bVar4) || (bVar4 = sVar1 == 0x1d, bVar4)) goto LAB_0012d94e;
    if (sVar1 == 0x21) {
      psVar3 = (x->value).type.name;
      if (((ulong)psVar3 & 3) == 0) {
        do {
          if (psVar3->tag != 6) goto LAB_0012d94b;
          iVar2 = nondefp((psVar3->value).type.name);
          if (iVar2 != 0) {
            bVar4 = true;
            break;
          }
          psVar3 = (psVar3->value).type.cpl;
          bVar4 = false;
        } while (((ulong)psVar3 & 3) == 0);
      }
      else {
LAB_0012d94b:
        bVar4 = false;
      }
      goto LAB_0012d94e;
    }
  }
  bVar4 = false;
LAB_0012d94e:
  return (int)bVar4;
}

Assistant:

static int nondefp(sexp x) {
  sexp ls;
  if (sexp_pairp(x) || sexp_cndp(x))
    return 1;
  if (sexp_seqp(x))
    for (ls=sexp_seq_ls(x); sexp_pairp(ls); ls=sexp_cdr(ls))
      if (nondefp(sexp_car(ls)))
        return 1;
  return 0;
}